

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_memrchr.c
# Opt level: O0

void * Curl_memrchr(void *s,int c,size_t n)

{
  uchar *q;
  uchar *p;
  size_t n_local;
  int c_local;
  void *s_local;
  
  q = (uchar *)((n - 1) + (long)s);
  while( true ) {
    if (q < s) {
      return (void *)0x0;
    }
    if ((uint)*q == (c & 0xffU)) break;
    q = q + -1;
  }
  return q;
}

Assistant:

void *
Curl_memrchr(const void *s, int c, size_t n)
{
  const unsigned char *p = s;
  const unsigned char *q = s;

  p += n - 1;

  while(p >= q) {
    if(*p == (unsigned char)c)
      return (void *)p;
    p--;
  }

  return NULL;
}